

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O0

void Mvc_CoverDivideByLiteralQuo(Mvc_Cover_t *pCover,int iLit)

{
  int iVar1;
  Mvc_Cube_t *local_48;
  Mvc_Cube_t *local_40;
  Mvc_List_t *pList;
  Mvc_Cube_t *pPrev;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube;
  int iLit_local;
  Mvc_Cover_t *pCover_local;
  
  pList = (Mvc_List_t *)0x0;
  pCube2 = (pCover->lCubes).pHead;
  if (pCube2 == (Mvc_Cube_t *)0x0) {
    local_40 = (Mvc_Cube_t *)0x0;
  }
  else {
    local_40 = pCube2->pNext;
  }
  pPrev = local_40;
  do {
    if (pCube2 == (Mvc_Cube_t *)0x0) {
      return;
    }
    iVar1 = iLit >> 5;
    if ((pCube2->pData[iVar1] & 1 << ((byte)iLit & 0x1f)) == 0) {
      if (pList == (Mvc_List_t *)0x0) {
        (pCover->lCubes).pHead = pCube2->pNext;
      }
      else {
        pList->pHead = pCube2->pNext;
      }
      if ((pCover->lCubes).pTail == pCube2) {
        if (pCube2->pNext != (Mvc_Cube_t *)0x0) {
          __assert_fail("pCube->pNext == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                        ,0x180,"void Mvc_CoverDivideByLiteralQuo(Mvc_Cover_t *, int)");
        }
        (pCover->lCubes).pTail = (Mvc_Cube_t *)pList;
      }
      (pCover->lCubes).nItems = (pCover->lCubes).nItems + -1;
      Mvc_CubeFree(pCover,pCube2);
    }
    else {
      pCube2->pData[iVar1] = (1 << ((byte)iLit & 0x1f) ^ 0xffffffffU) & pCube2->pData[iVar1];
      pList = (Mvc_List_t *)pCube2;
    }
    pCube2 = pPrev;
    if (pPrev == (Mvc_Cube_t *)0x0) {
      local_48 = (Mvc_Cube_t *)0x0;
    }
    else {
      local_48 = pPrev->pNext;
    }
    pPrev = local_48;
  } while( true );
}

Assistant:

void Mvc_CoverDivideByLiteralQuo( Mvc_Cover_t * pCover, int iLit )
{
    Mvc_Cube_t * pCube, * pCube2, * pPrev;
    // delete those cubes that do not have this literal
    // remove this literal from other cubes
    pPrev = NULL;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        if ( Mvc_CubeBitValue( pCube, iLit ) == 0 )
        { // delete the cube from the cover
            Mvc_CoverDeleteCube( pCover, pPrev, pCube );
            Mvc_CubeFree( pCover, pCube );
            // don't update the previous cube
        }
        else
        { // delete this literal from the cube
            Mvc_CubeBitRemove( pCube, iLit );
            // update the previous cube
            pPrev = pCube;
        }
    }
}